

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.c
# Opt level: O0

int decode(uchar *src,int len,uchar *dst,int buf_max)

{
  int iVar1;
  int local_40;
  int local_3c;
  int rerr;
  int w_pos;
  int s_pos;
  int pos;
  unsigned_short b;
  unsigned_short dat;
  int buf_max_local;
  uchar *dst_local;
  int len_local;
  uchar *src_local;
  
  w_pos = 0;
  local_3c = 0;
  rerr = 0;
  local_40 = 0;
  s_pos._2_2_ = 0;
  s_pos._0_2_ = 0;
  do {
    if (len <= w_pos) {
      if (local_40 == 0) {
        src_local._4_4_ = local_3c;
      }
      else {
        src_local._4_4_ = -local_40;
      }
      return src_local._4_4_;
    }
    if (src[w_pos] < 0x40) {
      local_40 = local_40 + 1;
    }
    else {
      s_pos._0_2_ = src[w_pos] - 0x40;
    }
    s_pos._2_2_ = s_pos._2_2_ | (short)s_pos << (10U - (char)rerr & 0x1f);
    iVar1 = rerr + 6;
    if (7 < rerr + 6) {
      dst[local_3c] = (uchar)(s_pos._2_2_ >> 8);
      local_3c = local_3c + 1;
      if (buf_max <= local_3c) {
        return 0;
      }
      s_pos._2_2_ = s_pos._2_2_ << 8;
      iVar1 = rerr + -2;
    }
    rerr = iVar1;
    w_pos = w_pos + 1;
  } while( true );
}

Assistant:

int decode(const unsigned char* src, int len, unsigned char* dst, int buf_max)
{
  unsigned short dat, b;
  int pos, s_pos, w_pos;
  int rerr;
  pos = 0;    // read position
  w_pos = 0;  // write_position
  s_pos = 0;  // shift position
  rerr = 0;
  dat = 0;
  b = 0;
  while (pos < len)
  {
    if (src[pos] >= 0x40)
      b = src[pos] - 0x40;
    else
      rerr++;

    dat |= (b << (10 - s_pos));
    s_pos += 6;
    if (s_pos >= 8)
    {
      dst[w_pos] = (dat >> 8);
      w_pos++;
      if (w_pos >= buf_max)
        return 0;
      s_pos -= 8;
      dat = dat << 8;
    }
    pos++;
  }

  if (rerr)
    return -rerr;
  return w_pos;
}